

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

BTreeImpl * __thiscall kj::_::BTreeImpl::operator=(BTreeImpl *this,BTreeImpl *other)

{
  bool bVar1;
  Fault local_60;
  Fault f;
  BTreeImpl *local_50;
  BTreeImpl *local_48;
  undefined1 local_40 [8];
  DebugComparison<kj::_::BTreeImpl_*,_kj::_::BTreeImpl_*> _kjCondition;
  BTreeImpl *other_local;
  BTreeImpl *this_local;
  
  local_50 = other;
  _kjCondition._32_8_ = other;
  local_48 = (BTreeImpl *)
             DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_50);
  f.exception = (Exception *)this;
  DebugExpression<kj::_::BTreeImpl*>::operator!=
            ((DebugComparison<kj::_::BTreeImpl_*,_kj::_::BTreeImpl_*> *)local_40,
             (DebugExpression<kj::_::BTreeImpl*> *)&local_48,(BTreeImpl **)&f);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::BTreeImpl*,kj::_::BTreeImpl*>&>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x8d,FAILED,"&other != this","_kjCondition,",
               (DebugComparison<kj::_::BTreeImpl_*,_kj::_::BTreeImpl_*> *)local_40);
    Debug::Fault::fatal(&local_60);
  }
  if (this->tree != (NodeUnion *)EMPTY_NODE) {
    ::free(this->tree);
  }
  this->tree = *(NodeUnion **)_kjCondition._32_8_;
  this->treeCapacity = *(uint *)(_kjCondition._32_8_ + 8);
  this->height = *(uint *)(_kjCondition._32_8_ + 0xc);
  this->freelistHead = *(uint *)(_kjCondition._32_8_ + 0x10);
  this->freelistSize = *(uint *)(_kjCondition._32_8_ + 0x14);
  this->beginLeaf = *(uint *)(_kjCondition._32_8_ + 0x18);
  this->endLeaf = *(uint *)(_kjCondition._32_8_ + 0x1c);
  *(undefined1 **)_kjCondition._32_8_ = EMPTY_NODE;
  *(undefined4 *)(_kjCondition._32_8_ + 8) = 1;
  *(undefined4 *)(_kjCondition._32_8_ + 0xc) = 0;
  *(undefined4 *)(_kjCondition._32_8_ + 0x10) = 1;
  *(undefined4 *)(_kjCondition._32_8_ + 0x14) = 0;
  *(undefined4 *)(_kjCondition._32_8_ + 0x18) = 0;
  *(undefined4 *)(_kjCondition._32_8_ + 0x1c) = 0;
  return this;
}

Assistant:

BTreeImpl& BTreeImpl::operator=(BTreeImpl&& other) {
  KJ_DASSERT(&other != this);

  if (tree != &EMPTY_NODE) {
    aligned_free(tree);
  }
  tree = other.tree;
  treeCapacity = other.treeCapacity;
  height = other.height;
  freelistHead = other.freelistHead;
  freelistSize = other.freelistSize;
  beginLeaf = other.beginLeaf;
  endLeaf = other.endLeaf;

  other.tree = const_cast<NodeUnion*>(&EMPTY_NODE);
  other.treeCapacity = 1;
  other.height = 0;
  other.freelistHead = 1;
  other.freelistSize = 0;
  other.beginLeaf = 0;
  other.endLeaf = 0;

  return *this;
}